

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
typeCheckValue(UA_Server *server,UA_NodeId *targetDataTypeId,UA_Int32 targetValueRank,
              size_t targetArrayDimensionsSize,UA_UInt32 *targetArrayDimensions,UA_Variant *value,
              UA_NumericRange *range,UA_Variant *editableValue)

{
  byte bVar1;
  UA_UInt16 UVar2;
  UA_DataType *pUVar3;
  size_t *psVar4;
  byte bVar5;
  void *pvVar6;
  UA_VariantStorageType UVar7;
  undefined4 uVar8;
  UA_Boolean UVar9;
  UA_StatusCode UVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  UA_UInt32 *pUVar16;
  UA_DataType *pUVar17;
  undefined1 local_78 [8];
  UA_NodeId subtypeId;
  UA_UInt32 tempArrayDimensions;
  
  pUVar3 = value->type;
  if (pUVar3 == (UA_DataType *)0x0) goto LAB_0011ead3;
  UVar9 = UA_NodeId_equal(&pUVar3->typeId,targetDataTypeId);
  if (UVar9) goto LAB_0011ead3;
  local_78._0_2_ = 0;
  stack0xffffffffffffff8c = 0x2d00000000;
  UVar9 = isNodeInTree(server->nodestore,&pUVar3->typeId,targetDataTypeId,(UA_NodeId *)local_78,1);
  if (UVar9) goto LAB_0011ead3;
  if (editableValue == (UA_Variant *)0x0) {
    return 0x80740000;
  }
  pUVar17 = (UA_DataType *)0x0;
  lVar15 = 0;
  do {
    if (*(UA_UInt32 *)((long)&UA_TYPES[0].typeId.identifier + lVar15) ==
        (targetDataTypeId->identifier).numeric) {
      pUVar17 = (UA_DataType *)((long)&UA_TYPES[0].typeName + lVar15);
      break;
    }
    lVar15 = lVar15 + 0x30;
  } while (lVar15 != 0x1e90);
  if (pUVar17 == (UA_DataType *)0x0) {
LAB_0011ece7:
    editableValue = (UA_Variant *)0x0;
  }
  else if (((pUVar3 == (UA_DataType *)0x13f650 && pUVar17 == (UA_DataType *)0x13f410) &&
           (value->arrayLength == 0)) && (psVar4 = (size_t *)value->data, (size_t *)0x1 < psVar4)) {
    editableValue->storageType = UA_VARIANT_DATA_NODELETE;
    editableValue->type = (UA_DataType *)0x13f410;
    editableValue->arrayLength = *psVar4;
    editableValue->data = (void *)psVar4[1];
  }
  else {
    iVar13 = 0;
    bVar5 = 0;
    iVar14 = 0;
    if (pUVar17->membersSize == '\x01') {
      bVar1 = pUVar17->members->field_0xb;
      bVar5 = 0;
      if ((bVar1 & 1) != 0) {
        UVar2 = pUVar17->members->memberTypeIndex;
        bVar5 = 1;
        if (UVar2 == 5) {
          iVar14 = 1;
        }
        else if ((UVar2 != 2) || (iVar14 = 2, (bVar1 & 2) == 0)) {
          bVar5 = 0;
          iVar14 = 0;
        }
      }
    }
    if (pUVar3->membersSize == '\x01') {
      bVar1 = pUVar3->members->field_0xb;
      if ((bVar1 & 1) != 0) {
        UVar2 = pUVar3->members->memberTypeIndex;
        if (UVar2 == 5) {
          iVar13 = 1;
        }
        else if ((UVar2 != 2) || (iVar13 = 2, (bVar1 & 2) == 0)) {
          iVar13 = 0;
        }
      }
    }
    if ((bool)(bVar5 ^ 1 | iVar14 != iVar13)) goto LAB_0011ece7;
    UVar7 = value->storageType;
    uVar8 = *(undefined4 *)&value->field_0xc;
    sVar12 = value->arrayLength;
    pvVar6 = value->data;
    sVar11 = value->arrayDimensionsSize;
    pUVar16 = value->arrayDimensions;
    editableValue->type = value->type;
    editableValue->storageType = UVar7;
    *(undefined4 *)&editableValue->field_0xc = uVar8;
    editableValue->arrayDimensionsSize = sVar11;
    editableValue->arrayDimensions = pUVar16;
    editableValue->arrayLength = sVar12;
    editableValue->data = pvVar6;
    editableValue->storageType = UA_VARIANT_DATA_NODELETE;
    editableValue->type = pUVar17;
  }
  value = editableValue;
  if (editableValue == (UA_Variant *)0x0) {
    return 0x80740000;
  }
LAB_0011ead3:
  UVar10 = 0;
  if (range == (UA_NumericRange *)0x0) {
    sVar12 = value->arrayDimensionsSize;
    pUVar16 = value->arrayDimensions;
    sVar11 = sVar12;
    if (pUVar16 == (UA_UInt32 *)0x0) {
      if ((value->arrayLength == 0) && ((void *)0x1 < value->data)) {
        pUVar16 = (UA_UInt32 *)0x0;
      }
      else {
        pUVar16 = (UA_UInt32 *)((long)&subtypeId.identifier + 0xc);
        subtypeId.identifier._12_4_ = (int)value->arrayLength;
        sVar11 = 1;
      }
    }
    if (targetArrayDimensionsSize == 0) {
      UVar10 = 0;
      if (value->data != (void *)0x0) {
        if (value->arrayLength != 0) {
          sVar12 = 1;
        }
        if (value->data < (void *)0x2) {
          sVar12 = 1;
        }
        UVar10 = compatibleValueRankArrayDimensions(targetValueRank,sVar12);
        return UVar10;
      }
    }
    else {
      UVar10 = 0x80740000;
      if (sVar11 == targetArrayDimensionsSize) {
        sVar12 = 0;
        do {
          if ((targetArrayDimensions[sVar12] != 0) &&
             (targetArrayDimensions[sVar12] != pUVar16[sVar12])) {
            return 0x80740000;
          }
          sVar12 = sVar12 + 1;
        } while (targetArrayDimensionsSize != sVar12);
        UVar10 = 0;
      }
    }
  }
  return UVar10;
}

Assistant:

UA_StatusCode
typeCheckValue(UA_Server *server, const UA_NodeId *targetDataTypeId,
               UA_Int32 targetValueRank, size_t targetArrayDimensionsSize,
               const UA_UInt32 *targetArrayDimensions, const UA_Variant *value,
               const UA_NumericRange *range, UA_Variant *editableValue) {
    /* Empty variant is only allowed for BaseDataType */
    if(!value->type)
        goto check_array;

    /* See if the types match. The nodeid on the wire may be != the nodeid in
     * the node for opaque types, enums and bytestrings. value contains the
     * correct type definition after the following paragraph */
    if(UA_NodeId_equal(&value->type->typeId, targetDataTypeId))
        goto check_array;

    /* Has the value a subtype of the required type? */
    const UA_NodeId subtypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    if(isNodeInTree(server->nodestore, &value->type->typeId, targetDataTypeId, &subtypeId, 1))
        goto check_array;

    /* Try to convert to a matching value if this is wanted */
    if(!editableValue)
        return UA_STATUSCODE_BADTYPEMISMATCH;
    value = convertToMatchingValue(server, value, targetDataTypeId, editableValue);
    if(!value)
        return UA_STATUSCODE_BADTYPEMISMATCH;

 check_array:
    if(range) /* array dimensions are checked later when writing the range */
        return UA_STATUSCODE_GOOD;

    size_t valueArrayDimensionsSize = value->arrayDimensionsSize;
    UA_UInt32 *valueArrayDimensions = value->arrayDimensions;
    UA_UInt32 tempArrayDimensions;
    if(valueArrayDimensions == 0 && !UA_Variant_isScalar(value)) {
        valueArrayDimensionsSize = 1;
        tempArrayDimensions = (UA_UInt32)value->arrayLength;
        valueArrayDimensions = &tempArrayDimensions;
    }

    /* See if the array dimensions match. When arrayDimensions are defined, they
     * already hold the valuerank. */
    if(targetArrayDimensionsSize > 0)
        return compatibleArrayDimensions(targetArrayDimensionsSize, targetArrayDimensions,
                                         valueArrayDimensionsSize, valueArrayDimensions);

    /* Check if the valuerank allows for the value dimension */
    return compatibleValueRankValue(targetValueRank, value);
}